

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O0

uint64_t __thiscall
llvm::DataExtractor::getULEB128(DataExtractor *this,uint64_t *offset_ptr,Error *Err)

{
  ulong uVar1;
  uint64_t uVar2;
  bool bVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  error_code EC;
  error_code local_70;
  Error local_60;
  DataExtractor *local_58;
  uint64_t result;
  char *pcStack_48;
  uint bytes_read;
  char *error;
  ErrorAsOutParameter local_30;
  ErrorAsOutParameter ErrAsOut;
  Error *Err_local;
  uint64_t *offset_ptr_local;
  DataExtractor *this_local;
  
  uVar1 = *offset_ptr;
  ErrAsOut.Err = Err;
  sVar4 = StringRef::size(&this->Data);
  if (uVar1 <= sVar4) {
    ErrorAsOutParameter::ErrorAsOutParameter(&local_30,ErrAsOut.Err);
    bVar3 = isError(ErrAsOut.Err);
    if (bVar3) {
      this_local = (DataExtractor *)0x0;
    }
    else {
      pcVar5 = StringRef::data(&this->Data);
      uVar2 = *offset_ptr;
      pcVar6 = StringRef::data(&this->Data);
      sVar4 = StringRef::size(&this->Data);
      local_58 = (DataExtractor *)
                 decodeULEB128((uint8_t *)(pcVar5 + uVar2),(uint *)((long)&result + 4),
                               (uint8_t *)(pcVar6 + sVar4),&stack0xffffffffffffffb8);
      if (pcStack_48 == (char *)0x0) {
        *offset_ptr = (ulong)result._4_4_ + *offset_ptr;
        this_local = local_58;
      }
      else {
        if (ErrAsOut.Err != (Error *)0x0) {
          std::error_code::error_code<llvm::errc,void>(&local_70,illegal_byte_sequence);
          EC._M_cat._0_4_ = local_70._M_value;
          EC._0_8_ = &local_60;
          EC._M_cat._4_4_ = 0;
          createStringError(EC,(char *)local_70._M_cat);
          Error::operator=(ErrAsOut.Err,&local_60);
          Error::~Error(&local_60);
        }
        this_local = (DataExtractor *)0x0;
      }
    }
    error._0_4_ = 1;
    ErrorAsOutParameter::~ErrorAsOutParameter(&local_30);
    return (uint64_t)this_local;
  }
  __assert_fail("*offset_ptr <= Data.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DataExtractor.cpp"
                ,0xb0,"uint64_t llvm::DataExtractor::getULEB128(uint64_t *, llvm::Error *) const");
}

Assistant:

uint64_t DataExtractor::getULEB128(uint64_t *offset_ptr,
                                   llvm::Error *Err) const {
  assert(*offset_ptr <= Data.size());
  ErrorAsOutParameter ErrAsOut(Err);
  if (isError(Err))
    return 0;

  const char *error;
  unsigned bytes_read;
  uint64_t result = decodeULEB128(
      reinterpret_cast<const uint8_t *>(Data.data() + *offset_ptr), &bytes_read,
      reinterpret_cast<const uint8_t *>(Data.data() + Data.size()), &error);
  if (error) {
    if (Err)
      *Err = createStringError(errc::illegal_byte_sequence, error);
    return 0;
  }
  *offset_ptr += bytes_read;
  return result;
}